

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

FrameDisplay *
TTD::NSSnapValues::InflateScriptFunctionScopeInfo
          (ScriptFunctionScopeInfo *funcScopeInfo,InflateMap *inflator)

{
  ushort uVar1;
  Type TVar2;
  int iVar3;
  ScopeInfoEntry *pSVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  ScriptContext *pSVar8;
  Recycler *this;
  undefined4 *puVar9;
  FrameDisplay *this_00;
  RecyclableObject *item;
  ulong uVar10;
  long lVar11;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pSVar8 = InflateMap::LookupScriptContext(inflator,funcScopeInfo->ScriptContextLogId);
  data.typeinfo = (type_info *)((ulong)funcScopeInfo->ScopeCount << 3);
  local_58 = (undefined1  [8])&Js::FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_44157ed;
  data.filename._0_4_ = 0x300;
  this = Memory::Recycler::TrackAllocInfo(pSVar8->recycler,(TrackAllocData *)local_58);
  uVar1 = funcScopeInfo->ScopeCount;
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar6) goto LAB_0092bc66;
    *puVar9 = 0;
  }
  this_00 = (FrameDisplay *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this,(ulong)uVar1 * 8 + 8);
  if (this_00 == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar6) {
LAB_0092bc66:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  TVar2 = funcScopeInfo->ScopeCount;
  this_00->tag = true;
  this_00->strictMode = false;
  this_00->length = TVar2;
  this_00->unused = 0;
  if (TVar2 != 0) {
    lVar11 = 8;
    uVar10 = 0;
    do {
      pSVar4 = funcScopeInfo->ScopeArray;
      iVar3 = *(int *)((long)pSVar4 + lVar11 + -8);
      if (iVar3 == 2) {
LAB_0092bc0f:
        item = InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)((long)&pSVar4->Tag + lVar11));
      }
      else {
        if (iVar3 != 1) {
          if (iVar3 != 0) {
            TTDAbort_unrecoverable_error("Unknown scope kind");
          }
          goto LAB_0092bc0f;
        }
        item = (RecyclableObject *)
               InflateMap::LookupSlotArray(inflator,*(TTD_PTR_ID *)((long)&pSVar4->Tag + lVar11));
      }
      Js::FrameDisplay::SetItem(this_00,(uint)uVar10,item);
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < funcScopeInfo->ScopeCount);
  }
  return this_00;
}

Assistant:

Js::FrameDisplay* InflateScriptFunctionScopeInfo(const ScriptFunctionScopeInfo* funcScopeInfo, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(funcScopeInfo->ScriptContextLogId);

            Js::FrameDisplay* environment = RecyclerNewPlus(ctx->GetRecycler(), funcScopeInfo->ScopeCount * sizeof(Js::Var), Js::FrameDisplay, funcScopeInfo->ScopeCount);

            for(uint16 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                const ScopeInfoEntry& scp = funcScopeInfo->ScopeArray[i];

                switch(scp.Tag)
                {
                case Js::ScopeType::ScopeType_ActivationObject:
                case Js::ScopeType::ScopeType_WithScope:
                {
                    Js::Var sval = inflator->LookupObject(scp.IDValue);
                    environment->SetItem(i, sval);
                    break;
                }
                case Js::ScopeType::ScopeType_SlotArray:
                {
                    Field(Js::Var)* saval = inflator->LookupSlotArray(scp.IDValue);
                    environment->SetItem(i, saval);
                    break;
                }
                default:
                    TTDAssert(false, "Unknown scope kind");
                    break;
                }
            }

            return environment;
        }